

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void Curl_updateconninfo(connectdata *conn,curl_socket_t sockfd)

{
  Curl_easy *pCVar1;
  Curl_handler *pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Bool _Var8;
  int iVar9;
  uint *puVar10;
  char *pcVar11;
  uint err;
  char *fmt;
  curl_socklen_t len;
  Curl_sockaddr_storage ssloc;
  Curl_sockaddr_storage ssrem;
  socklen_t local_12c;
  sockaddr local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  sockaddr local_a0 [8];
  
  if (conn->socktype == 2) {
    return;
  }
  if (((conn->bits).reuse == false) && ((conn->bits).tcp_fastopen == false)) {
    pCVar1 = conn->data;
    local_12c = 0x80;
    iVar9 = getpeername(sockfd,local_a0,&local_12c);
    if (iVar9 == 0) {
      local_12c = 0x80;
      local_128.sa_family = 0;
      local_128.sa_data[0] = '\0';
      local_128.sa_data[1] = '\0';
      local_128.sa_data[2] = '\0';
      local_128.sa_data[3] = '\0';
      local_128.sa_data[4] = '\0';
      local_128.sa_data[5] = '\0';
      local_128.sa_data[6] = '\0';
      local_128.sa_data[7] = '\0';
      local_128.sa_data[8] = '\0';
      local_128.sa_data[9] = '\0';
      local_128.sa_data[10] = '\0';
      local_128.sa_data[0xb] = '\0';
      local_128.sa_data[0xc] = '\0';
      local_128.sa_data[0xd] = '\0';
      local_118 = 0;
      uStack_110 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      iVar9 = getsockname(sockfd,&local_128,&local_12c);
      if (iVar9 == 0) {
        _Var8 = Curl_getaddressinfo((sockaddr *)local_a0,conn->primary_ip,&conn->primary_port);
        if (_Var8) {
          uVar3 = *(undefined8 *)conn->primary_ip;
          uVar4 = *(undefined8 *)(conn->primary_ip + 8);
          uVar5 = *(undefined8 *)(conn->primary_ip + 0x10);
          uVar6 = *(undefined8 *)(conn->primary_ip + 0x18);
          uVar7 = *(undefined8 *)(conn->primary_ip + 0x26);
          *(undefined8 *)(conn->ip_addr_str + 0x1e) = *(undefined8 *)(conn->primary_ip + 0x1e);
          *(undefined8 *)(conn->ip_addr_str + 0x26) = uVar7;
          *(undefined8 *)(conn->ip_addr_str + 0x10) = uVar5;
          *(undefined8 *)(conn->ip_addr_str + 0x18) = uVar6;
          *(undefined8 *)conn->ip_addr_str = uVar3;
          *(undefined8 *)(conn->ip_addr_str + 8) = uVar4;
          _Var8 = Curl_getaddressinfo((sockaddr *)&local_128,conn->local_ip,&conn->local_port);
          if (_Var8) goto LAB_00127c96;
          puVar10 = (uint *)__errno_location();
          err = *puVar10;
          pcVar11 = Curl_strerror(conn,err);
          fmt = "ssloc inet_ntop() failed with errno %d: %s";
        }
        else {
          puVar10 = (uint *)__errno_location();
          err = *puVar10;
          pcVar11 = Curl_strerror(conn,err);
          fmt = "ssrem inet_ntop() failed with errno %d: %s";
        }
      }
      else {
        puVar10 = (uint *)__errno_location();
        err = *puVar10;
        pcVar11 = Curl_strerror(conn,err);
        fmt = "getsockname() failed with errno %d: %s";
      }
    }
    else {
      puVar10 = (uint *)__errno_location();
      err = *puVar10;
      pcVar11 = Curl_strerror(conn,err);
      fmt = "getpeername() failed with errno %d: %s";
    }
    Curl_failf(pCVar1,fmt,(ulong)err,pcVar11);
  }
  else {
LAB_00127c96:
    pCVar1 = conn->data;
    uVar3 = *(undefined8 *)(conn->primary_ip + 0x26);
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x1e) =
         *(undefined8 *)(conn->primary_ip + 0x1e);
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x26) = uVar3;
    uVar3 = *(undefined8 *)(conn->primary_ip + 0x18);
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x10) =
         *(undefined8 *)(conn->primary_ip + 0x10);
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x18) = uVar3;
    uVar3 = *(undefined8 *)(conn->primary_ip + 8);
    *(undefined8 *)(pCVar1->info).conn_primary_ip = *(undefined8 *)conn->primary_ip;
    *(undefined8 *)((pCVar1->info).conn_primary_ip + 8) = uVar3;
    pCVar1 = conn->data;
    uVar3 = *(undefined8 *)(conn->local_ip + 0x18);
    *(undefined8 *)((pCVar1->info).conn_local_ip + 0x10) = *(undefined8 *)(conn->local_ip + 0x10);
    *(undefined8 *)((pCVar1->info).conn_local_ip + 0x18) = uVar3;
    uVar3 = *(undefined8 *)(conn->local_ip + 0x26);
    *(undefined8 *)((pCVar1->info).conn_local_ip + 0x1e) = *(undefined8 *)(conn->local_ip + 0x1e);
    *(undefined8 *)((pCVar1->info).conn_local_ip + 0x26) = uVar3;
    uVar3 = *(undefined8 *)(conn->local_ip + 8);
    *(undefined8 *)(pCVar1->info).conn_local_ip = *(undefined8 *)conn->local_ip;
    *(undefined8 *)((pCVar1->info).conn_local_ip + 8) = uVar3;
    pCVar2 = conn->handler;
    pCVar1 = conn->data;
    (pCVar1->info).conn_scheme = pCVar2->scheme;
    (pCVar1->info).conn_protocol = pCVar2->protocol;
    (pCVar1->info).conn_primary_port = conn->primary_port;
    (pCVar1->info).conn_local_port = conn->local_port;
  }
  return;
}

Assistant:

void Curl_updateconninfo(struct connectdata *conn, curl_socket_t sockfd)
{
  curl_socklen_t len;
  struct Curl_sockaddr_storage ssrem;
  struct Curl_sockaddr_storage ssloc;
  struct Curl_easy *data = conn->data;

  if(conn->socktype == SOCK_DGRAM)
    /* there's no connection! */
    return;

  if(!conn->bits.reuse && !conn->bits.tcp_fastopen) {
    len = sizeof(struct Curl_sockaddr_storage);
    if(getpeername(sockfd, (struct sockaddr*) &ssrem, &len)) {
      int error = SOCKERRNO;
      failf(data, "getpeername() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }

    len = sizeof(struct Curl_sockaddr_storage);
    memset(&ssloc, 0, sizeof(ssloc));
    if(getsockname(sockfd, (struct sockaddr*) &ssloc, &len)) {
      int error = SOCKERRNO;
      failf(data, "getsockname() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }

    if(!Curl_getaddressinfo((struct sockaddr*)&ssrem,
                            conn->primary_ip, &conn->primary_port)) {
      failf(data, "ssrem inet_ntop() failed with errno %d: %s",
            errno, Curl_strerror(conn, errno));
      return;
    }
    memcpy(conn->ip_addr_str, conn->primary_ip, MAX_IPADR_LEN);

    if(!Curl_getaddressinfo((struct sockaddr*)&ssloc,
                            conn->local_ip, &conn->local_port)) {
      failf(data, "ssloc inet_ntop() failed with errno %d: %s",
            errno, Curl_strerror(conn, errno));
      return;
    }

  }

  /* persist connection info in session handle */
  Curl_persistconninfo(conn);
}